

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,timer_holder *timer,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  bool bVar1;
  function<void_()> local_88;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  timer_object_holder<timertt::thread_safety::safe> local_58 [3];
  undefined1 local_40 [8];
  lock_guard locker;
  timer_action *action_local;
  timer_holder *timer_local;
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> period_local;
  duration<long,_std::ratio<1L,_1000000000L>_> pause_local;
  
  locker.m_lock._8_8_ = action;
  thread_mixin::lock_guard::lock_guard((lock_guard *)local_40,(thread_mixin *)this);
  thread_mixin::ensure_started((thread_mixin *)this);
  timer_object_holder<timertt::thread_safety::safe>::timer_object_holder(local_58,timer);
  local_68.__r = period.__r;
  local_60.__r = pause.__r;
  std::function<void_()>::function(&local_88,action);
  bVar1 = timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
          ::
          activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
                      *)(this + 0x68),local_58,local_60,local_68,&local_88);
  std::function<void_()>::~function(&local_88);
  timer_object_holder<timertt::thread_safety::safe>::~timer_object_holder(local_58);
  if (bVar1) {
    thread_mixin::notify((thread_mixin *)this);
  }
  thread_mixin::lock_guard::~lock_guard((lock_guard *)local_40);
  return;
}

Assistant:

void
	activate(
		//! Timer to be activated.
		timer_holder timer,
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		typename mixin_type::lock_guard locker{ *this };

		this->ensure_started();

		if( m_engine.activate(
				std::move( timer ), pause, period, std::move( action ) ) )
			this->notify();
	}